

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O2

void __thiscall
TPZFBMatrix<std::complex<float>_>::MultAdd
          (TPZFBMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined8 local_88;
  TPZFMatrix<std::complex<float>_> *local_80;
  long local_78;
  complex<float> local_60;
  complex<float> local_58;
  complex<float> local_50;
  long local_48;
  long local_40;
  complex<float> local_38;
  
  iVar4 = (int)alpha._M_value;
  iVar1 = iVar4;
  local_80 = z;
  if (iVar4 == 0) {
    lVar5 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 == (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00d75da4;
  }
  else {
    lVar5 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
LAB_00d75da4:
    if ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow == lVar5)
    goto LAB_00d75dbd;
  }
  TPZMatrix<std::complex<float>_>::Error
            ("virtual void TPZFBMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
             ,"TPZFBMatrix::MultAdd <matrixs with incompatible dimensions>");
LAB_00d75dbd:
  if (((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
       (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZFBMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ,"TPZFBMatrix::MultAdd incompatible dimensions\n");
  }
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,local_80,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar1);
  local_40 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  lVar5 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (local_40 < 1) {
    local_40 = 0;
  }
  local_48 = 0;
  if (0 < lVar5) {
    local_48 = lVar5;
  }
  lVar5 = 0;
  if (iVar4 == 0) {
    for (; lVar5 != local_48; lVar5 = lVar5 + 1) {
      lVar3 = 0;
      while (lVar3 != local_40) {
        lVar6 = lVar3 - this->fBandLower;
        if (lVar6 < 1) {
          lVar6 = 0;
        }
        local_78 = lVar3 + 1;
        lVar2 = this->fBandUpper + local_78;
        iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable
                  ._vptr_TPZSavable[0xc])(this);
        if (lVar2 < CONCAT44(extraout_var_01,iVar1)) {
          lVar2 = this->fBandUpper + local_78;
        }
        else {
          iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable[0xc])(this);
          lVar2 = CONCAT44(extraout_var_02,iVar1);
        }
        (*(local_80->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(local_80,lVar3,lVar5);
        local_88 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
        for (; lVar6 < lVar2; lVar6 = lVar6 + 1) {
          (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar3,lVar6);
          std::operator*(&local_38,&local_58);
          (*(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(x,lVar6,lVar5);
          std::operator*(&local_50,&local_60);
          local_88 = CONCAT44((float)((ulong)local_88 >> 0x20) + extraout_XMM0_Db_02,
                              (float)local_88 + extraout_XMM0_Da_02);
        }
        (*(local_80->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(local_80,lVar3,lVar5,&local_88);
        lVar3 = local_78;
      }
    }
  }
  else {
    for (; lVar5 != local_48; lVar5 = lVar5 + 1) {
      lVar3 = 0;
      while (lVar3 != local_40) {
        lVar6 = lVar3 - this->fBandLower;
        if (lVar6 < 1) {
          lVar6 = 0;
        }
        local_78 = lVar3 + 1;
        lVar2 = this->fBandUpper + local_78;
        iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable
                  ._vptr_TPZSavable[0xc])(this);
        if (lVar2 < CONCAT44(extraout_var,iVar1)) {
          lVar2 = this->fBandUpper + local_78;
        }
        else {
          iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable[0xc])(this);
          lVar2 = CONCAT44(extraout_var_00,iVar1);
        }
        (*(local_80->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(local_80,lVar3,lVar5);
        local_88 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        for (; lVar6 < lVar2; lVar6 = lVar6 + 1) {
          (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar6,lVar3);
          std::operator*(&local_38,&local_58);
          (*(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(x,lVar6,lVar5);
          std::operator*(&local_50,&local_60);
          local_88 = CONCAT44((float)((ulong)local_88 >> 0x20) + extraout_XMM0_Db_00,
                              (float)local_88 + extraout_XMM0_Da_00);
        }
        (*(local_80->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(local_80,lVar3,lVar5,&local_88);
        lVar3 = local_78;
      }
    }
  }
  return;
}

Assistant:

void TPZFBMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error(__PRETTY_FUNCTION__, "TPZFBMatrix::MultAdd <matrixs with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		this->Error(__PRETTY_FUNCTION__,"TPZFBMatrix::MultAdd incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);
	int64_t rows = this->Rows();
	int64_t xcols = x.Cols();
	int64_t ic, r;
	if(opt == 0) {
		for (ic = 0; ic < xcols; ic++) {
			int64_t begin, end;
			for ( r = 0; r < rows; r++ ) {
				begin = MAX( r - fBandLower, 0 );
				end   = MIN( r + fBandUpper + 1, Dim() );
				TVar val = z.GetVal(r,ic);
				// Calcula um elemento da resposta.
				for ( int64_t i = begin ; i < end; i++ ) val += alpha * GetVal( r, i ) * x.GetVal( i, ic );
				z.PutVal( r, ic, val );
			}
		}
	} else {
		for (ic = 0; ic < xcols; ic++) {
			int64_t begin, end;
			for ( r = 0; r < rows; r++ ) {
				begin = MAX( r - fBandLower, 0 );
				end   = MIN( r + fBandUpper + 1, Dim() );
				TVar val = z.GetVal(r,ic);
				// Calcula um elemento da resposta.
				for ( int64_t i = begin ; i < end; i++ ) val += alpha * GetVal( i, r ) * x.GetVal( i, ic );
				z.PutVal( r, ic, val );
			}
		}
	}
}